

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeSSA.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_111::TypeSSA::run(TypeSSA *this,Module *module_)

{
  __node_base_ptr *this_00;
  size_t *psVar1;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_01;
  pointer *__return_storage_ptr__;
  pointer puVar2;
  Global *pGVar3;
  pointer puVar4;
  pointer ppEVar5;
  long *plVar6;
  pointer puVar7;
  Function *pFVar8;
  bool bVar9;
  mapped_type *news;
  Struct *struct_;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  size_type sVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *existingNames;
  pointer ppEVar13;
  __node_base *p_Var14;
  uint __val;
  ElementSegment *pEVar15;
  value_type vVar16;
  __uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> _Var17;
  uint uVar18;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar19;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> uVar20;
  Type *this_02;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar21;
  long *plVar22;
  pointer puVar23;
  __uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
  _Var24;
  Name root;
  undefined1 auStack_488 [8];
  NewFinder moduleFinder;
  string local_390;
  undefined1 local_370 [8];
  ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  HeapType newType;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_328 [6];
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> intendedName;
  Array local_160;
  undefined1 local_150 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  existingTypeNames;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  typesSet;
  BuildResult result;
  size_t local_b8;
  undefined1 local_b0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> typesVec;
  Name newName;
  key_type local_78;
  value_type newType_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newTypes;
  HeapType oldType_1;
  TypeBuilder local_48;
  TypeBuilder builder;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *__range2;
  
  this->module = module_;
  if (((module_->features).features & 0x400) != 0) {
    intendedName.field_2._8_8_ = 0;
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_370,module_,(Func *)((long)&intendedName.field_2 + 8));
    std::_Function_base::~_Function_base((_Function_base *)((long)&intendedName.field_2 + 8));
    auStack_488 = (undefined1  [8])0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .replacep = (Expression **)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currModule = (Module *)0x0;
    moduleFinder.news.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    moduleFinder.news.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar20._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )this->module;
    puVar2 = *(pointer *)
              ((long)uVar20._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl + 0x38);
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currFunction =
         (Function *)
         uVar20._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    for (puVar21 = (((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      *)((long)uVar20._M_t.
                               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                        + 0x30))->
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
        puVar21 = puVar21 + 1) {
      pGVar3 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                *)auStack_488,&pGVar3->init);
      }
    }
    puVar4 = *(pointer *)
              ((long)uVar20._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl + 0x68);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         uVar20._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    for (puVar19 = (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      *)((long)uVar20._M_t.
                               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                        + 0x60))->
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar4;
        puVar19 = puVar19 + 1) {
      pEVar15 = (puVar19->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar15->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                *)auStack_488,&pEVar15->offset);
        pEVar15 = (puVar19->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      ppEVar5 = *(pointer *)
                 ((long)&(pEVar15->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl + 8);
      for (ppEVar13 = (pEVar15->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar13 != ppEVar5;
          ppEVar13 = ppEVar13 + 1) {
        analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppEVar13;
        Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                *)auStack_488,
               (Expression **)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    plVar6 = *(long **)((long)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                       + 0x98);
    for (plVar22 = *(long **)((long)builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl + 0x90); plVar22 != plVar6; plVar22 = plVar22 + 1)
    {
      if (*(long *)(*plVar22 + 0x30) != 0) {
        Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                *)auStack_488,(Expression **)(*plVar22 + 0x30));
      }
    }
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currFunction = (Function *)0x0;
    puVar7 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar23 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar7;
        puVar23 = puVar23 + 1) {
      pFVar8 = (puVar23->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar8->super_Importable).module + 8) == (char *)0x0) {
        analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pFVar8;
        news = std::
               map<wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ::operator[]((map<wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                             *)&analysis,
                            (key_type *)
                            &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        processNews(this,news);
      }
    }
    processNews(this,(News *)&moduleFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                              .currModule);
    ppEVar13 = (this->newsToModify).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppEVar5 = (this->newsToModify).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar13 != ppEVar5) {
      builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           ((long)ppEVar13 - (long)ppEVar5 >> 3);
      TypeBuilder::TypeBuilder
                (&local_48,
                 (size_t)builder.impl._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
      this_00 = &existingTypeNames._M_h._M_single_bucket;
      psVar1 = &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      for (uVar18 = 0;
          uVar20._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_ = 0,
          uVar20._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = uVar18,
          (ulong)uVar20._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl <
          (ulong)builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
          uVar18 = uVar18 + 1) {
        existingTypeNames._M_h._M_single_bucket =
             (__node_base_ptr)
             wasm::Type::getHeapType
                       (&(this->newsToModify).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(long)uVar20._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl]->type);
        bVar9 = HeapType::isStruct((HeapType *)this_00);
        if (bVar9) {
          struct_ = HeapType::getStruct((HeapType *)this_00);
          analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_48;
          TypeBuilder::Entry::operator=((Entry *)psVar1,struct_);
        }
        else {
          HeapType::getArray((HeapType *)&local_160);
          analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_48;
          TypeBuilder::Entry::operator=((Entry *)psVar1,&local_160);
        }
        analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_48;
        TypeBuilder::Entry::subTypeOf
                  ((Entry *)psVar1,(HeapType)existingTypeNames._M_h._M_single_bucket);
      }
      TypeBuilder::createRecGroup
                (&local_48,0,
                 (size_t)builder.impl._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
      TypeBuilder::build((BuildResult *)&typesSet._M_h._M_single_bucket,&local_48);
      if (result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _M_first._M_storage._M_storage[0x10] == '\x01') {
        __assert_fail("!result.getError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                      ,0xa2,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
      }
      __x = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)&typesSet._M_h._M_single_bucket);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&newType_1,__x);
      if ((long)newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_start - newType_1.id != (long)ppEVar13 - (long)ppEVar5)
      {
        __assert_fail("newTypes.size() == num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                      ,0xa4,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
      }
      wasm::ModuleUtils::collectHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_b0,this->module);
      existingNames =
           (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            *)0x0;
      std::
      _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&existingTypeNames._M_h._M_single_bucket,local_b0,
                 typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start,0,
                 &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,local_150,local_1a8)
      ;
      sVar10 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&existingTypeNames._M_h._M_single_bucket,(key_type *)newType_1.id);
      if (sVar10 != 0) {
        Fatal::Fatal((Fatal *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Fatal::operator<<((Fatal *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (char (*) [50])"Rec group collision in TypeSSA! Please file a bug");
        Fatal::~Fatal((Fatal *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      for (vVar16 = newType_1;
          _Var17._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
               (tuple<wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>)
               (tuple<wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>)
               builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
          (pointer)vVar16.id !=
          newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start; vVar16.id = vVar16.id + 8) {
        analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = ((pointer)vVar16.id)->id;
        sVar10 = std::
                 _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&existingTypeNames._M_h._M_single_bucket,
                         (key_type *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        if (sVar10 != 0) {
          __assert_fail("!typesSet.count(newType)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                        ,0xb8,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
        }
      }
      local_150 = (undefined1  [8])&existingTypeNames._M_h._M_rehash_policy._M_next_resize;
      existingTypeNames._M_h._M_buckets = (__buckets_ptr)0x1;
      existingTypeNames._M_h._M_bucket_count = 0;
      existingTypeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      existingTypeNames._M_h._M_element_count._0_4_ = 0x3f800000;
      existingTypeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      existingTypeNames._M_h._M_rehash_policy._4_4_ = 0;
      existingTypeNames._M_h._M_rehash_policy._M_next_resize = 0;
      this_01 = &this->module->typeNames;
      p_Var14 = &(this->module->typeNames)._M_h._M_before_begin;
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_150,(value_type *)(p_Var14 + 2));
      }
      for (uVar18 = 0;
          _Var24.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_ = 0,
          _Var24.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = uVar18,
          (ulong)_Var24.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl <
          (ulong)_Var17._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
          uVar18 = uVar18 + 1) {
        this_02 = &(this->newsToModify).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(long)_Var24.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl]->
                   type;
        newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)wasm::Type::getHeapType(this_02);
        local_78.id = *(uintptr_t *)
                       (newType_1.id +
                       (long)_Var24.
                             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl *
                       8);
        wasm::Type::Type((Type *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (HeapType)local_78.id,NonNullable);
        this_02->id = analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sVar11 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count(&this_01->_M_h,
                         (key_type *)
                         &newTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
        _Var17._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
             (tuple<wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             (tuple<wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             builder;
        if (sVar11 != 0) {
          pmVar12 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,
                                 (key_type *)
                                 &newTypes.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __return_storage_ptr__ =
               &typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
          IString::toString_abi_cxx11_((string *)__return_storage_ptr__,(IString *)pmVar12);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,'$');
          __val = this->nameCounter + 1;
          this->nameCounter = __val;
          std::__cxx11::to_string(&local_390,__val);
          psVar1 = &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1
                         ,&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)psVar1);
          std::__cxx11::string::~string
                    ((string *)
                     &typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          IString::IString((IString *)
                           ((long)&result.
                                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           + 0x18),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a8);
          root.super_IString.str._M_str = local_150;
          root.super_IString.str._M_len = local_b8;
          join_0x00000010_0x00000000_ =
               (string_view)
               Names::
               getValidNameGivenExisting<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
                         ((Names *)result.
                                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   .
                                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                   ._24_8_,root,existingNames);
          pmVar12 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,
                                 (key_type *)
                                 &newTypes.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          TypeNames::TypeNames
                    ((TypeNames *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     pmVar12);
          analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          pmVar12 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_78);
          TypeNames::operator=
                    (pmVar12,(TypeNames *)
                             &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__detail::
          _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)local_150,
                   (value_type *)
                   &typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(local_328);
          std::__cxx11::string::~string((string *)local_1a8);
        }
      }
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_150);
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&existingTypeNames._M_h._M_single_bucket);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_b0);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&newType_1);
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           *)&typesSet._M_h._M_single_bucket);
      TypeBuilder::~TypeBuilder(&local_48);
    }
    NewFinder::~NewFinder((NewFinder *)auStack_488);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 *)&analysis);
  }
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the struct/array.news.

    ModuleUtils::ParallelFunctionAnalysis<News> analysis(
      *module, [&](Function* func, News& news) {
        if (func->imported()) {
          return;
        }

        NewFinder finder;
        finder.walk(func->body);
        news = std::move(finder.news);
      });

    // Also find news in the module scope.
    NewFinder moduleFinder;
    moduleFinder.walkModuleCode(module);

    // Process all the news to find the ones we want to modify, adding them to
    // newsToModify. Note that we must do so in a deterministic order.
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { processNews(analysis.map[func]); });
    processNews(moduleFinder.news);

    // Modify the ones we found are relevant. We must modify them all at once as
    // in the isorecursive type system we want to create a single new rec group
    // for them all (see below).
    modifyNews();
  }